

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::SourceInfoTest_EnumReservedRange_Test::TestBody
          (SourceInfoTest_EnumReservedRange_Test *this)

{
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar1;
  bool bVar2;
  char *pcVar3;
  EnumDescriptorProto *pEVar4;
  FileDescriptorProto *this_00;
  char *in_R9;
  string local_308;
  AssertHelper local_2e8;
  Message local_2e0;
  allocator<char> local_2d1;
  string local_2d0;
  bool local_2a9;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_278;
  Message local_270;
  bool local_261;
  undefined1 local_260 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_230;
  Message local_228;
  bool local_219;
  undefined1 local_218 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_1e8;
  Message local_1e0;
  allocator<char> local_1d1;
  string local_1d0;
  bool local_1a9;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_178;
  Message local_170;
  allocator<char> local_161;
  string local_160;
  bool local_139;
  undefined1 local_138 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_108;
  Message local_100;
  bool local_f1;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_c0;
  Message local_b8;
  allocator<char> local_a9;
  string local_a8;
  bool local_81;
  undefined1 local_80 [8];
  AssertionResult gtest_ar__1;
  EnumReservedRange *bar;
  AssertHelper local_48 [3];
  Message local_30;
  bool local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  SourceInfoTest_EnumReservedRange_Test *this_local;
  
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  local_21 = SourceInfoTest::Parse
                       (&this->super_SourceInfoTest,
                        "enum TestEnum {\n  $a$reserved $b$1$c$ to $d$10$e$;$f$\n}");
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_20,&local_21,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar2) {
    testing::Message::Message(&local_30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&bar,(internal *)local_20,
               (AssertionResult *)
               "Parse(\"enum TestEnum {\\n\" \"  $a$reserved $b$1$c$ to $d$10$e$;$f$\\n\" \"}\")",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
               ,0xe56,pcVar3);
    testing::internal::AssertHelper::operator=(local_48,&local_30);
    testing::internal::AssertHelper::~AssertHelper(local_48);
    std::__cxx11::string::~string((string *)&bar);
    testing::Message::~Message(&local_30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  this_00 = &(this->super_SourceInfoTest).file_;
  pEVar4 = FileDescriptorProto::enum_type(this_00,0);
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )EnumDescriptorProto::reserved_range(pEVar4,0);
  pEVar4 = FileDescriptorProto::enum_type(this_00,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"reserved_range",&local_a9)
  ;
  local_81 = SourceInfoTest::HasSpan
                       (&this->super_SourceInfoTest,'a','f',&pEVar4->super_Message,&local_a8);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_80,&local_81,(type *)0x0)
  ;
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar2) {
    testing::Message::Message(&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_80,
               (AssertionResult *)"HasSpan(\'a\', \'f\', file_.enum_type(0), \"reserved_range\")",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
               ,0xe5b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  local_f1 = SourceInfoTest::HasSpan
                       (&this->super_SourceInfoTest,'b','e',
                        (Message *)
                        gtest_ar__1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_f0,&local_f1,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar2) {
    testing::Message::Message(&local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_f0,
               (AssertionResult *)"HasSpan(\'b\', \'e\', bar)","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
               ,0xe5c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_108,&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  uVar1 = gtest_ar__1.message_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"start",&local_161);
  local_139 = SourceInfoTest::HasSpan
                        (&this->super_SourceInfoTest,'b','c',
                         (Message *)
                         uVar1._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl,&local_160);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_138,&local_139,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator(&local_161);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar2) {
    testing::Message::Message(&local_170);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_138,
               (AssertionResult *)"HasSpan(\'b\', \'c\', bar, \"start\")","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
               ,0xe5d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_178,&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  uVar1 = gtest_ar__1.message_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"end",&local_1d1);
  local_1a9 = SourceInfoTest::HasSpan
                        (&this->super_SourceInfoTest,'d','e',
                         (Message *)
                         uVar1._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl,&local_1d0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1a8,&local_1a9,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
  if (!bVar2) {
    testing::Message::Message(&local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_1a8,
               (AssertionResult *)"HasSpan(\'d\', \'e\', bar, \"end\")","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
               ,0xe5e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_1e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
  local_219 = SourceInfoTest::HasSpan
                        (&this->super_SourceInfoTest,
                         &(this->super_SourceInfoTest).file_.super_Message);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_218,&local_219,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
  if (!bVar2) {
    testing::Message::Message(&local_228);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_218,
               (AssertionResult *)"HasSpan(file_)","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
               ,0xe61,pcVar3);
    testing::internal::AssertHelper::operator=(&local_230,&local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
  pEVar4 = FileDescriptorProto::enum_type(&(this->super_SourceInfoTest).file_,0);
  local_261 = SourceInfoTest::HasSpan(&this->super_SourceInfoTest,&pEVar4->super_Message);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_260,&local_261,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
  if (!bVar2) {
    testing::Message::Message(&local_270);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_260,
               (AssertionResult *)"HasSpan(file_.enum_type(0))","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
               ,0xe62,pcVar3);
    testing::internal::AssertHelper::operator=(&local_278,&local_270);
    testing::internal::AssertHelper::~AssertHelper(&local_278);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_270);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
  pEVar4 = FileDescriptorProto::enum_type(&(this->super_SourceInfoTest).file_,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"name",&local_2d1);
  local_2a9 = SourceInfoTest::HasSpan(&this->super_SourceInfoTest,&pEVar4->super_Message,&local_2d0)
  ;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2a8,&local_2a9,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
  if (!bVar2) {
    testing::Message::Message(&local_2e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_308,(internal *)local_2a8,
               (AssertionResult *)"HasSpan(file_.enum_type(0), \"name\")","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
               ,0xe63,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2e8,&local_2e0);
    testing::internal::AssertHelper::~AssertHelper(&local_2e8);
    std::__cxx11::string::~string((string *)&local_308);
    testing::Message::~Message(&local_2e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
  return;
}

Assistant:

TEST_F(SourceInfoTest, EnumReservedRange) {
  EXPECT_TRUE(
      Parse("enum TestEnum {\n"
            "  $a$reserved $b$1$c$ to $d$10$e$;$f$\n"
            "}"));

  const EnumDescriptorProto::EnumReservedRange& bar =
      file_.enum_type(0).reserved_range(0);

  EXPECT_TRUE(HasSpan('a', 'f', file_.enum_type(0), "reserved_range"));
  EXPECT_TRUE(HasSpan('b', 'e', bar));
  EXPECT_TRUE(HasSpan('b', 'c', bar, "start"));
  EXPECT_TRUE(HasSpan('d', 'e', bar, "end"));

  // Ignore these.
  EXPECT_TRUE(HasSpan(file_));
  EXPECT_TRUE(HasSpan(file_.enum_type(0)));
  EXPECT_TRUE(HasSpan(file_.enum_type(0), "name"));
}